

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  byte bVar1;
  RepeatedField<bool> *pRVar2;
  int *piVar3;
  _func_int *p_Var4;
  LogMessage *pLVar5;
  MessageLite *pMVar6;
  long lVar7;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->is_repeated != true) {
    if ((this->field_0xa & 1) != 0) {
      return;
    }
    bVar1 = this->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar5 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_51,pLVar5);
      LogMessage::~LogMessage(&local_50);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      piVar3 = ((this->field_0).repeated_int32_value)->elements_;
      if ((this->field_0xa & 0x10) == 0) {
        (**(code **)(piVar3 + 8))();
      }
      else {
        (**(code **)(piVar3 + 0x16))();
      }
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 9) {
      pRVar2 = (this->field_0).repeated_bool_value;
      pRVar2->current_size_ = 0;
      pRVar2->total_size_ = 0;
      *pRVar2->elements_ = false;
    }
    this->field_0xa = (this->field_0xa & 0xf0) + 1;
    return;
  }
  bVar1 = this->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar5 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_51,pLVar5);
    LogMessage::~LogMessage(&local_50);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    pMVar6 = (this->field_0).message_value;
    break;
  case 9:
    pMVar6 = (this->field_0).message_value;
    if (0 < *(int *)&pMVar6[1]._vptr_MessageLite) {
      lVar7 = 0;
      do {
        p_Var4 = pMVar6->_vptr_MessageLite[lVar7];
        *(undefined8 *)(p_Var4 + 8) = 0;
        **(undefined1 **)p_Var4 = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)&pMVar6[1]._vptr_MessageLite);
    }
    break;
  case 10:
    pMVar6 = (this->field_0).message_value;
    if (0 < *(int *)&pMVar6[1]._vptr_MessageLite) {
      lVar7 = 0;
      do {
        (**(code **)(*(long *)pMVar6->_vptr_MessageLite[lVar7] + 0x20))();
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)&pMVar6[1]._vptr_MessageLite);
    }
    *(undefined4 *)&pMVar6[1]._vptr_MessageLite = 0;
  default:
    goto switchD_001fa357_default;
  }
  *(undefined4 *)&pMVar6[1]._vptr_MessageLite = 0;
switchD_001fa357_default:
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                          \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
        repeated_##LOWERCASE##_value->Clear();                     \
        break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            lazymessage_value->Clear();
          } else {
            message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}